

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
captureExpression<(Catch::Internal::Operator)0,char[1]>
          (ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          char (*rhs) [1])

{
  bool result;
  ResultBuilder *pRVar1;
  basic_string_view<char,_std::char_traits<char>_> *_value;
  char *value;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  result = Internal::
           Evaluator<std::basic_string_view<char,_std::char_traits<char>_>,_char[1],_(Catch::Internal::Operator)0>
           ::evaluate(*(basic_string_view<char,_std::char_traits<char>_> **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Detail::StringMakerBase<true>::convert<std::basic_string_view<char,std::char_traits<char>>>
            (&local_38,*(StringMakerBase<true> **)(this + 8),_value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)rhs,value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }